

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86ADC(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,int num)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *puVar4;
  uchar *start;
  int shift_local;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  uchar *stream_local;
  
  if (size != sDWORD && size != sQWORD) {
    __assert_fail("size == sDWORD || size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x4c3,"int x86ADC(unsigned char *, x86Size, x86Reg, int, x86Reg, int, int)");
  }
  uVar1 = encodeRex(stream,size == sQWORD,rNONE,index,base);
  puVar3 = stream + uVar1;
  if ((char)num == num) {
    puVar4 = puVar3 + 1;
    *puVar3 = 0x83;
    uVar1 = encodeAddress(puVar4,index,multiplier,base,shift,2);
    uVar2 = encodeImmByte(puVar4 + uVar1,(char)num);
    stream_local._4_4_ = ((int)(puVar4 + uVar1) + uVar2) - (int)stream;
  }
  else {
    puVar4 = puVar3 + 1;
    *puVar3 = 0x81;
    uVar1 = encodeAddress(puVar4,index,multiplier,base,shift,2);
    uVar2 = encodeImmDword(puVar4 + uVar1,num);
    stream_local._4_4_ = ((int)(puVar4 + uVar1) + uVar2) - (int)stream;
  }
  return stream_local._4_4_;
}

Assistant:

int x86ADC(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, int num)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, rNONE, index, base);

	if((char)num == num)
	{
		*stream++ = 0x83;
		stream += encodeAddress(stream, index, multiplier, base, shift, 2);
		stream += encodeImmByte(stream, (char)num);

		return int(stream - start);
	}

	*stream++ = 0x81;
	stream += encodeAddress(stream, index, multiplier, base, shift, 2);
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}